

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

double __thiscall
HighsDomain::getColUpperPos(HighsDomain *this,HighsInt col,HighsInt stackpos,HighsInt *pos)

{
  double dVar1;
  int iVar2;
  pointer ppVar3;
  int *piVar4;
  pointer ppVar5;
  
  ppVar5 = (pointer)((this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + col);
  piVar4 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + col;
  ppVar3 = (this->prevboundval_).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    dVar1 = ppVar5->first;
    iVar2 = *piVar4;
    *pos = iVar2;
    if ((iVar2 <= stackpos) &&
       (((iVar2 == -1 || (ppVar3[iVar2].first != dVar1)) || (NAN(ppVar3[iVar2].first) || NAN(dVar1))
        ))) break;
    ppVar5 = ppVar3 + iVar2;
    piVar4 = &ppVar3[iVar2].second;
  }
  return dVar1;
}

Assistant:

double HighsDomain::getColUpperPos(HighsInt col, HighsInt stackpos,
                                   HighsInt& pos) const {
  double ub = col_upper_[col];
  pos = colUpperPos_[col];
  while (pos > stackpos || (pos != -1 && prevboundval_[pos].first == ub)) {
    ub = prevboundval_[pos].first;
    pos = prevboundval_[pos].second;
  }
  return ub;
}